

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebServer.cpp
# Opt level: O3

void __thiscall WebServer::start(WebServer *this)

{
  element_type *peVar1;
  EventLoop *pEVar2;
  WebServer *pWVar3;
  undefined1 local_1030 [4008];
  char *local_88 [6];
  _Any_data local_58;
  code *local_48;
  code *local_40;
  ChannelPtr local_38;
  
  EventLoopThreadPool::start
            ((this->reactorPool_)._M_t.
             super___uniq_ptr_impl<EventLoopThreadPool,_std::default_delete<EventLoopThreadPool>_>.
             _M_t.
             super__Tuple_impl<0UL,_EventLoopThreadPool_*,_std::default_delete<EventLoopThreadPool>_>
             .super__Head_base<0UL,_EventLoopThreadPool_*,_false>._M_head_impl);
  HttpConnPool::start(&this->connPool_);
  ignoreSigpipe();
  peVar1 = (this->acceptChannel_).super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_58._8_8_ = 0;
  local_58._M_unused._M_object = operator_new(0x18);
  *(code **)local_58._M_unused._0_8_ = connectionCallback;
  *(undefined8 *)((long)local_58._M_unused._0_8_ + 8) = 0;
  *(WebServer **)((long)local_58._M_unused._0_8_ + 0x10) = this;
  local_40 = std::_Function_handler<void_(),_std::_Bind<void_(WebServer::*(WebServer_*))()>_>::
             _M_invoke;
  local_48 = std::_Function_handler<void_(),_std::_Bind<void_(WebServer::*(WebServer_*))()>_>::
             _M_manager;
  std::function<void_()>::operator=(&peVar1->readCallback_,(function<void_()> *)&local_58);
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,__destroy_functor);
  }
  local_38.super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->acceptChannel_).super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (local_38.super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->events_ = -0x7fffffff;
  pEVar2 = this->loop_;
  local_38.super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (this->acceptChannel_).super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
       _M_pi;
  if (local_38.super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_38.super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_38.super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_38.super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_38.super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi)->_M_use_count + 1;
    }
  }
  EventLoop::addChannel(pEVar2,&local_38);
  if (local_38.super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_38.super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  pEVar2 = (EventLoop *)(local_1030 + 0x10);
  pWVar3 = (WebServer *)local_1030;
  local_1030._0_8_ = pEVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)pWVar3,"/index.html","");
  cachePage(pWVar3,(string *)local_1030);
  if ((EventLoop *)local_1030._0_8_ != pEVar2) {
    operator_delete((void *)local_1030._0_8_);
  }
  pWVar3 = (WebServer *)local_1030;
  local_1030._0_8_ = pEVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)pWVar3,"/404.html","");
  cachePage(pWVar3,(string *)local_1030);
  if ((EventLoop *)local_1030._0_8_ != pEVar2) {
    operator_delete((void *)local_1030._0_8_);
  }
  pWVar3 = (WebServer *)local_1030;
  local_1030._0_8_ = pEVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)pWVar3,"/400.html","");
  cachePage(pWVar3,(string *)local_1030);
  if ((EventLoop *)local_1030._0_8_ != pEVar2) {
    operator_delete((void *)local_1030._0_8_);
  }
  pWVar3 = (WebServer *)local_1030;
  local_1030._0_8_ = pEVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)pWVar3,"/403.html","");
  cachePage(pWVar3,(string *)local_1030);
  if ((EventLoop *)local_1030._0_8_ != pEVar2) {
    operator_delete((void *)local_1030._0_8_);
  }
  this->started_ = true;
  Logger::Logger((Logger *)local_1030,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Raven65[P]WebServer/WebServer.cpp"
                 ,0x51);
  if (0x1a < (int)local_88 - (int)local_88[0]) {
    builtin_strncpy(local_88[0],"WebServer started on port ",0x1a);
    local_88[0] = local_88[0] + 0x1a;
  }
  LogStream::operator<<((LogStream *)local_1030,this->port_);
  Logger::~Logger((Logger *)local_1030);
  return;
}

Assistant:

void WebServer::start() {
    reactorPool_->start();
    connPool_.start();
    ignoreSigpipe();    
    acceptChannel_->setReadCallback(std::bind(&WebServer::connectionCallback, this));
    acceptChannel_->setEvent(EPOLLIN | EPOLLET);
    loop_->addChannel(acceptChannel_);
    cachePage("/index.html");
    cachePage("/404.html");
    cachePage("/400.html");
    cachePage("/403.html");
    started_ = true;
    LOG << "WebServer started on port " <<port_;
}